

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_printer.hpp
# Opt level: O2

void __thiscall Args::HelpPrinter::~HelpPrinter(HelpPrinter *this)

{
  (this->super_HelpPrinterIface)._vptr_HelpPrinterIface = (_func_int **)&PTR__HelpPrinter_001159c0;
  std::__cxx11::string::~string((string *)&this->m_appDescription);
  std::__cxx11::string::~string((string *)&this->m_exeName);
  return;
}

Assistant:

inline
HelpPrinter::~HelpPrinter()
{
}